

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtcore.cpp
# Opt level: O2

void rtcDetachGeometry(RTCScene hscene,uint geomID)

{
  undefined8 *puVar1;
  allocator local_49;
  DeviceEnterLeave enterleave;
  
  if (hscene == (RTCScene)0x0) {
    puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
    std::__cxx11::string::string((string *)&enterleave,"invalid argument",&local_49);
    *puVar1 = &PTR__rtcore_error_021d38e0;
    *(undefined4 *)(puVar1 + 1) = 2;
    std::__cxx11::string::string((string *)(puVar1 + 2),(string *)&enterleave);
    __cxa_throw(puVar1,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
  }
  if (geomID != 0xffffffff) {
    embree::DeviceEnterLeave::DeviceEnterLeave(&enterleave,hscene);
    embree::Scene::detachGeometry((Scene *)hscene,(ulong)geomID);
    embree::DeviceEnterLeave::~DeviceEnterLeave(&enterleave);
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&enterleave,"invalid argument",&local_49);
  *puVar1 = &PTR__rtcore_error_021d38e0;
  *(undefined4 *)(puVar1 + 1) = 2;
  std::__cxx11::string::string((string *)(puVar1 + 2),(string *)&enterleave);
  __cxa_throw(puVar1,&embree::rtcore_error::typeinfo,embree::rtcore_error::~rtcore_error);
}

Assistant:

RTC_API void rtcDetachGeometry (RTCScene hscene, unsigned int geomID)
  {
    Scene* scene = (Scene*) hscene;
    RTC_CATCH_BEGIN;
    RTC_TRACE(rtcDetachGeometry);
    RTC_VERIFY_HANDLE(hscene);
    RTC_VERIFY_GEOMID(geomID);
    RTC_ENTER_DEVICE(hscene);
    scene->detachGeometry(geomID);
    RTC_CATCH_END2(scene);
  }